

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

Reflection * google::protobuf::internal::GetReflectionOrDie(Message *m)

{
  int iVar1;
  undefined4 extraout_var;
  LogMessage *pLVar2;
  Reflection *extraout_RDX;
  LogFinisher local_69;
  string local_68;
  LogMessage local_48;
  
  (*(m->super_MessageLite)._vptr_MessageLite[0x15])();
  if (extraout_RDX == (Reflection *)0x0) {
    iVar1 = (*(m->super_MessageLite)._vptr_MessageLite[0x15])(m);
    if ((undefined8 *)CONCAT44(extraout_var,iVar1) == (undefined8 *)0x0) {
      std::__cxx11::string::string((string *)&local_68,"unknown",(allocator *)&local_48);
    }
    else {
      std::__cxx11::string::string((string *)&local_68,*(string **)CONCAT44(extraout_var,iVar1));
    }
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x3c);
    pLVar2 = LogMessage::operator<<(&local_48,"Message does not support reflection (type ");
    pLVar2 = LogMessage::operator<<(pLVar2,&local_68);
    pLVar2 = LogMessage::operator<<(pLVar2,").");
    LogFinisher::operator=(&local_69,pLVar2);
    LogMessage::~LogMessage(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return extraout_RDX;
}

Assistant:

static const Reflection* GetReflectionOrDie(const Message& m) {
  const Reflection* r = m.GetReflection();
  if (r == nullptr) {
    const Descriptor* d = m.GetDescriptor();
    const std::string& mtype = d ? d->name() : "unknown";
    // RawMessage is one known type for which GetReflection() returns nullptr.
    GOOGLE_LOG(FATAL) << "Message does not support reflection (type " << mtype << ").";
  }
  return r;
}